

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::DiskSourceTree::MapPath
          (DiskSourceTree *this,string *virtual_path,string *disk_path)

{
  pointer pcVar1;
  string local_a0;
  undefined1 local_80 [32];
  _Alloc_hider local_60;
  char local_50 [16];
  string local_40;
  
  pcVar1 = (disk_path->_M_dataplus)._M_p;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar1,pcVar1 + disk_path->_M_string_length);
  CanonicalizePath(&local_a0,&local_40);
  pcVar1 = (virtual_path->_M_dataplus)._M_p;
  local_80._0_8_ = local_80 + 0x10;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_80,pcVar1,pcVar1 + virtual_path->_M_string_length);
  local_60._M_p = local_50;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,local_a0._M_dataplus._M_p,
             local_a0._M_dataplus._M_p + local_a0._M_string_length);
  std::
  vector<google::protobuf::compiler::DiskSourceTree::Mapping,_std::allocator<google::protobuf::compiler::DiskSourceTree::Mapping>_>
  ::emplace_back<google::protobuf::compiler::DiskSourceTree::Mapping>
            (&this->mappings_,(Mapping *)local_80);
  if (local_60._M_p != local_50) {
    operator_delete(local_60._M_p);
  }
  if ((undefined1 *)local_80._0_8_ != local_80 + 0x10) {
    operator_delete((void *)local_80._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return;
}

Assistant:

void DiskSourceTree::MapPath(const std::string& virtual_path,
                             const std::string& disk_path) {
  mappings_.push_back(Mapping(virtual_path, CanonicalizePath(disk_path)));
}